

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O3

ptr<req_msg> __thiscall
nuraft::raft_server::create_append_entries_req(raft_server *this,ptr<peer> *pp)

{
  undefined4 uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _func_int **pp_Var5;
  undefined1 *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  element_type *peVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined **ppuVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  uint uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var18;
  long lVar19;
  undefined8 uVar20;
  ulong prev_end_idx;
  mutex_type *pmVar21;
  ptr<req_msg> pVar22;
  unique_lock<std::recursive_mutex> guard;
  ptr<req_msg> *req;
  ptr<snapshot> snp_local;
  undefined1 local_d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  log_val_type local_8a;
  undefined1 local_89;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  raft_server *local_78;
  int local_6c;
  _Any_data local_68;
  undefined1 local_58 [40];
  
  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*in_RDX;
  local_d8._0_8_ = pp + 0x3e;
  local_d8._8_8_ = local_d8._8_8_ & 0xffffffffffffff00;
  local_78 = this;
  local_58._16_8_ = in_RDX;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_d8);
  local_d8[8] = 1;
  local_b0._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (*(code *)((((pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->endpoint_).field_2._M_allocated_capacity)();
  peVar3 = pp[9].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pp[10].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88 = ((pp[0x2d].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             config_).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_d8);
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)&p_Var17[0xd]._M_use_count);
  if (iVar10 != 0) {
    std::__throw_system_error(iVar10);
  }
  p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(peVar3->config_).
                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
  lVar19._0_4_ = p_Var17[6]._M_use_count;
  lVar19._4_4_ = p_Var17[6]._M_weak_count;
  if (lVar19 == 0) {
    LOCK();
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var17[6]._M_use_count = p_Var13;
    UNLOCK();
  }
  p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var17[6]._M_use_count;
  puVar6 = (undefined1 *)((long)&p_Var14[-1]._M_weak_count + 3);
  local_a0._M_pi = p_Var17;
  pthread_mutex_unlock((pthread_mutex_t *)&p_Var17[0xd]._M_use_count);
  p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6;
  if (p_Var13 <= puVar6) {
    if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 1 < iVar10)) {
      p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"Peer\'s lastLogIndex is too large %lu v.s. %lu, ",local_a8,
                 p_Var13);
      (*p_Var17->_vptr__Sp_counted_base[8])
                (p_Var17,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x18b,(string *)local_d8);
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    pp_Var5 = (pp[0x15].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base;
    (**(code **)(*pp_Var5 + 0x40))(pp_Var5,0xfffffff8);
    exit(-1);
  }
  if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 5 < iVar10)) {
    p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    msg_if_given_abi_cxx11_
              ((string *)local_d8,"last_log_idx: %lu, starting_idx: %lu, cur_nxt_idx: %lu\n",
               local_a8,local_b0._M_pi,p_Var13);
    (*p_Var17->_vptr__Sp_counted_base[8])
              (p_Var17,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"create_append_entries_req",0x199,(string *)local_d8);
    if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  context::get_params((context *)local_d8);
  p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&p_Var14->_vptr__Sp_counted_base + (long)*(int *)(local_d8._0_8_ + 0x24));
  if (p_Var13 <= p_Var17) {
    p_Var17 = p_Var13;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_68._M_unused._M_object = local_a0._M_pi[0x1d]._vptr__Sp_counted_base;
  uVar20 = (long)&p_Var14->_vptr__Sp_counted_base + 1;
  p_Var18 = p_Var17;
  local_68._8_8_ = uVar20;
  if ((p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_unused._0_8_) &&
     ((ulong)uVar20 < p_Var17)) {
    LOCK();
    local_a0._M_pi[0x1d]._M_use_count = local_a0._M_pi[0x1d]._M_use_count + 1;
    UNLOCK();
    uVar16 = local_a0._M_pi[0x1d]._M_use_count;
    p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar10 = (*p_Var4->_vptr__Sp_counted_base[7])(), 4 < iVar10)) {
      p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,"last sent log (%lu) to peer %d is not applied, cnt %d",p_Var14,
                 (ulong)*(uint *)(local_a0._M_pi)->_vptr__Sp_counted_base,(ulong)uVar16);
      (*p_Var4->_vptr__Sp_counted_base[8])
                (p_Var4,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1ad,local_d8);
      uVar20 = local_68._8_8_;
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
        uVar20 = local_68._8_8_;
      }
    }
    _Var11._M_pi = local_b0._M_pi;
    if (4 < (int)uVar16) {
      p_Var18 = p_Var13;
      if ((ulong)uVar20 < p_Var13) {
        p_Var18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar20;
      }
      p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar10 = (*p_Var4->_vptr__Sp_counted_base[7])(), _Var11._M_pi = local_b0._M_pi, 4 < iVar10
         )) {
        p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        msg_if_given_abi_cxx11_((string *)local_d8,"reduce end_idx %lu -> %lu",p_Var17,p_Var18);
        (*p_Var4->_vptr__Sp_counted_base[8])
                  (p_Var4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1b1,local_d8);
        _Var11._M_pi = local_b0._M_pi;
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
  }
  else {
    LOCK();
    local_a0._M_pi[0x1d]._M_use_count = 0;
    UNLOCK();
    _Var11._M_pi = local_b0._M_pi;
  }
  if (p_Var14 < p_Var13) {
    if (p_Var14 < _Var11._M_pi) {
      local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      peVar3 = pp[0x2e].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar20._0_4_ = local_a0._M_pi[7]._M_use_count;
      uVar20._4_4_ = local_a0._M_pi[7]._M_weak_count;
      (**(code **)&((peVar3->config_).
                    super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   learner_)(local_d8,peVar3,p_Var14,p_Var18,uVar20);
      local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      pmVar21 = (mutex_type *)local_d8._0_8_;
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)0x0) goto LAB_0018e08b;
      p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      _Var11._M_pi = local_b0._M_pi;
      if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), _Var11._M_pi = local_b0._M_pi,
         2 < iVar10)) {
        p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,"failed to retrieve log entries: %lu - %lu",p_Var14,p_Var18);
        (*p_Var17->_vptr__Sp_counted_base[8])
                  (p_Var17,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1bf,local_d8);
        _Var11._M_pi = local_b0._M_pi;
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
  }
  else {
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar21 = (mutex_type *)0x0;
    if (_Var11._M_pi <= p_Var14) {
LAB_0018e08b:
      _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     term_for_log((raft_server *)pp,local_a8);
      p_Var17 = p_Var18;
      if ((pmVar21 == (mutex_type *)0x0) ||
         (p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var14->_vptr__Sp_counted_base +
                    ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&(pmVar21->super___recursive_mutex_base)._M_mutex + 8))->_M_pi -
                     (long)(pmVar21->super___recursive_mutex_base)._M_mutex.__align >> 4)),
         p_Var13 == p_Var18)) {
LAB_0018e0b7:
        p_Var18 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        p_Var13 = p_Var17;
        if ((p_Var18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar10 = (*p_Var18->_vptr__Sp_counted_base[7])(), 4 < iVar10)) {
          if (pmVar21 == (mutex_type *)0x0) {
            lVar19 = 0;
          }
          else {
            lVar19 = (long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&(pmVar21->super___recursive_mutex_base)._M_mutex + 8))->_M_pi -
                     (long)(pmVar21->super___recursive_mutex_base)._M_mutex.__align >> 4;
          }
          p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_d8,
                     "append_entries for %d with LastLogIndex=%lu, LastLogTerm=%lu, EntriesLength=%zu, CommitIndex=%lu, Term=%lu, peer_last_sent_idx %lu"
                     ,(ulong)*(uint *)(local_a0._M_pi)->_vptr__Sp_counted_base,local_a8,_Var11._M_pi
                     ,lVar19,local_80._M_pi,local_88,local_68._M_unused._M_object);
          (*p_Var17->_vptr__Sp_counted_base[8])
                    (p_Var17,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x208,local_d8);
          if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
            operator_delete((void *)local_d8._0_8_);
          }
        }
      }
      else {
        p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])();
          p_Var17 = p_Var13;
          if (5 < iVar10) {
            p_Var4 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            local_b0._M_pi = _Var11._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)local_d8,"adjusted end_idx due to batch size hint: %lu -> %lu",
                       p_Var18,p_Var13);
            (*p_Var4->_vptr__Sp_counted_base[8])
                      (p_Var4,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x200,local_d8);
            _Var11._M_pi = local_b0._M_pi;
            if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_);
            }
          }
          goto LAB_0018e0b7;
        }
      }
      if (p_Var14 == p_Var13) {
        p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 5 < iVar10)) {
          p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_d8,"EMPTY PAYLOAD");
          (*p_Var17->_vptr__Sp_counted_base[8])
                    (p_Var17,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20a,local_d8);
          goto LAB_0018e745;
        }
      }
      else {
        p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ == p_Var13) {
          if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 4 < iVar10)) {
            p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            msg_if_given_abi_cxx11_((string *)local_d8,"idx: %lu",p_Var14);
            (*p_Var17->_vptr__Sp_counted_base[8])
                      (p_Var17,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                       ,"create_append_entries_req",0x20c,local_d8);
LAB_0018e745:
            if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_);
            }
          }
        }
        else if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 4 < iVar10)) {
          p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_d8,"idx range: %lu-%lu",p_Var14,
                     (undefined1 *)((long)&p_Var13[-1]._M_weak_count + 3));
          (*p_Var17->_vptr__Sp_counted_base[8])
                    (p_Var17,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                     ,"create_append_entries_req",0x20e,local_d8);
          goto LAB_0018e745;
        }
      }
      uVar1 = *(undefined4 *)(local_a0._M_pi)->_vptr__Sp_counted_base;
      peVar12 = (element_type *)operator_new(0x60);
      ppuVar15 = &PTR__req_msg_005c12c0;
      (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x100000001;
      peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c1270;
      uVar2 = *(undefined4 *)
               &pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (peVar12->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_88;
      *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 3;
      *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
      *(undefined4 *)&peVar12->bg_append_ea_ = uVar1;
      (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005c12c0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar12->initialized_ = _Var11._M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar12->id_ = local_a8;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar12->target_priority_ = local_80._M_pi;
      (peVar12->priority_change_timer_).t_created_.__d.__r = 0;
      (peVar12->priority_change_timer_).duration_us_ = 0;
      *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
      (local_78->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
      local_78->_vptr_raft_server =
           (_func_int **)
           &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      if (pmVar21 != (mutex_type *)0x0) {
        std::
        vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<nuraft::log_entry>*,std::vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>>>
                  ((vector<std::shared_ptr<nuraft::log_entry>,std::allocator<std::shared_ptr<nuraft::log_entry>>>
                    *)&peVar12->priority_change_timer_,0,
                   (element_type *)(pmVar21->super___recursive_mutex_base)._M_mutex.__align,
                   ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(pmVar21->super___recursive_mutex_base)._M_mutex + 8))->_M_pi);
        ppuVar15 = (undefined **)extraout_RDX_01;
      }
      LOCK();
      local_a0._M_pi[0x1d]._vptr__Sp_counted_base = (_func_int **)p_Var14;
      UNLOCK();
      p_Var17 = local_98;
      goto LAB_0018e829;
    }
  }
  get_last_snapshot((raft_server *)local_58);
  if ((((_func_int **)local_58._0_8_ == (_func_int **)0x0) || (_Var11._M_pi <= local_a8)) ||
     (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_58._0_8_ <= local_a8)) {
    if ((create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer == '\0') &&
       (iVar10 = __cxa_guard_acquire(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::
                                      msg_timer), iVar10 != 0)) {
      create_append_entries_req::msg_timer.t_created_.__d.__r = (duration)0;
      create_append_entries_req::msg_timer.duration_us_ = (long)"ess signing cert v2 add error" + 10
      ;
      create_append_entries_req::msg_timer.first_event_fired_ = true;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__align = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex._8_8_ = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex._16_8_ = 0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__prev =
           (__pthread_internal_list *)0x0;
      create_append_entries_req::msg_timer.lock_.super___mutex_base._M_mutex.__data.__list.__next =
           (__pthread_internal_list *)0x0;
      timer_helper::reset(&create_append_entries_req::msg_timer);
      __cxa_guard_release(&create_append_entries_req(std::shared_ptr<nuraft::peer>&)::msg_timer);
      _Var11._M_pi = local_b0._M_pi;
    }
    bVar9 = timer_helper::timeout_and_reset(&create_append_entries_req::msg_timer);
    p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])();
      uVar16 = (uint)!bVar9 * 4 + 2;
      if ((int)uVar16 <= iVar10) {
        p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        msg_if_given_abi_cxx11_
                  ((string *)local_d8,
                   "neither snapshot nor log exists, peer %d, last log %lu, leader\'s start log %lu"
                   ,(ulong)*(uint *)(local_a0._M_pi)->_vptr__Sp_counted_base,local_a8,_Var11._M_pi);
        (*p_Var17->_vptr__Sp_counted_base[8])
                  (p_Var17,(ulong)uVar16,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"create_append_entries_req",0x1e2,local_d8);
        if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_);
        }
      }
    }
    uVar1 = *(undefined4 *)(local_a0._M_pi)->_vptr__Sp_counted_base;
    peVar12 = (element_type *)operator_new(0x60);
    (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c1270;
    uVar2 = *(undefined4 *)
             &pp[3].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (peVar12->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_88;
    *(undefined4 *)&(peVar12->bg_append_thread_)._M_id._M_thread = 0x1c;
    *(undefined4 *)((long)&(peVar12->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
    *(undefined4 *)&peVar12->bg_append_ea_ = uVar1;
    (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__req_msg_005c12c0;
    peVar12->initialized_ = (__atomic_base<bool>)0x0;
    *(undefined3 *)&peVar12->field_0x31 = 0;
    peVar12->leader_ = (__atomic_base<int>)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar12->id_ = local_a8;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&peVar12->target_priority_ = local_80._M_pi;
    (peVar12->priority_change_timer_).t_created_.__d.__r = 0;
    (peVar12->priority_change_timer_).duration_us_ = 0;
    *(undefined8 *)&(peVar12->priority_change_timer_).first_event_fired_ = 0;
    (local_78->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
    local_78->_vptr_raft_server =
         (_func_int **)
         &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    p_Var13->_M_use_count = 1;
    p_Var13->_M_weak_count = 1;
    p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c1308;
    p_Var13[1]._vptr__Sp_counted_base = (_func_int **)_Var11._M_pi;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var14->_M_use_count = 1;
    p_Var14->_M_weak_count = 1;
    p_Var14->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c1358;
    *(undefined4 *)&p_Var14[1]._vptr__Sp_counted_base = 1;
    p_Var14[1]._M_use_count = 0;
    p_Var14[1]._M_weak_count = 0;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    out_of_log_msg::serialize((out_of_log_msg *)local_d8);
    uVar8 = local_d8._8_8_;
    uVar20 = local_d8._0_8_;
    local_d8._0_8_ = (mutex_type *)0x0;
    uVar7 = local_d8._0_8_;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var17 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14[2]._vptr__Sp_counted_base;
    local_d8._0_4_ = (undefined4)uVar20;
    local_d8._4_4_ = SUB84(uVar20,4);
    p_Var14[1]._M_use_count = local_d8._0_4_;
    p_Var14[1]._M_weak_count = local_d8._4_4_;
    p_Var14[2]._vptr__Sp_counted_base = (_func_int **)uVar8;
    local_d8._0_8_ = uVar7;
    if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    local_6c = 0;
    custom_notification_msg::serialize((custom_notification_msg *)(local_58 + 0x18));
    local_8a = custom;
    local_d8._0_8_ = (mutex_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(log_entry **)local_d8,
               (allocator<nuraft::log_entry> *)&local_89,&local_6c,
               (shared_ptr<nuraft::buffer> *)(local_58 + 0x18),&local_8a);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._32_8_);
    }
    std::
    vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 *)&peVar12->priority_change_timer_,(value_type *)local_d8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var13);
    ppuVar15 = (undefined **)extraout_RDX;
  }
  else {
    p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if ((p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar10 = (*p_Var17->_vptr__Sp_counted_base[7])(), 4 < iVar10)) {
      p_Var17 = pp[0x31].super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_d8,
                 "send snapshot peer %d, peer log idx: %lu, my starting idx: %lu, my log idx: %lu, last_snapshot_log_idx: %lu"
                 ,(ulong)*(uint *)(local_a0._M_pi)->_vptr__Sp_counted_base,local_a8,_Var11._M_pi,
                 p_Var13,*(_func_int **)local_58._0_8_);
      (*p_Var17->_vptr__Sp_counted_base[8])
                (p_Var17,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"create_append_entries_req",0x1d5,local_d8);
      if ((mutex_type *)local_d8._0_8_ != (mutex_type *)(local_d8 + 0x10)) {
        operator_delete((void *)local_d8._0_8_);
      }
    }
    local_d8._0_8_ = local_d8._0_8_ & 0xffffffffffffff00;
    pVar22 = create_sync_snapshot_req
                       (local_78,pp,local_58._16_8_,(ulong)local_a8,(ulong)local_88,
                        (bool *)local_80._M_pi);
    ppuVar15 = (undefined **)
               pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  }
  p_Var17 = local_98;
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    ppuVar15 = (undefined **)extraout_RDX_00;
  }
LAB_0018e829:
  if (p_Var17 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var17);
    ppuVar15 = (undefined **)extraout_RDX_02;
  }
  pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar15;
  pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_78;
  return (ptr<req_msg>)pVar22.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<req_msg> raft_server::create_append_entries_req(ptr<peer>& pp) {
    peer& p = *pp;
    ulong cur_nxt_idx(0L);
    ulong commit_idx(0L);
    ulong last_log_idx(0L);
    ulong term(0L);
    ulong starting_idx(1L);

    {
        recur_lock(lock_);
        starting_idx = log_store_->start_index();
        cur_nxt_idx = precommit_index_ + 1;
        commit_idx = quick_commit_index_;
        term = state_->get_term();
    }

    {
        std::lock_guard<std::mutex> guard(p.get_lock());
        if (p.get_next_log_idx() == 0L) {
            p.set_next_log_idx(cur_nxt_idx);
        }

        last_log_idx = p.get_next_log_idx() - 1;
    }

    if (last_log_idx >= cur_nxt_idx) {
        // LCOV_EXCL_START
        p_er( "Peer's lastLogIndex is too large %" PRIu64 " v.s. %" PRIu64 ", ",
              last_log_idx, cur_nxt_idx );
        ctx_->state_mgr_->system_exit(raft_err::N8_peer_last_log_idx_too_large);
        ::exit(-1);
        return ptr<req_msg>();
        // LCOV_EXCL_STOP
    }

    // cur_nxt_idx: last log index of myself (leader).
    // starting_idx: start log index of myself (leader).
    // last_log_idx: last log index of replica (follower).
    // end_idx: if (cur_nxt_idx - last_log_idx) > max_append_size, limit it.

    p_tr("last_log_idx: %" PRIu64 ", starting_idx: %" PRIu64
         ", cur_nxt_idx: %" PRIu64 "\n",
         last_log_idx, starting_idx, cur_nxt_idx);

    // Verify log index range.
    bool entries_valid = (last_log_idx + 1 >= starting_idx);

    // Read log entries. The underlying log store may have removed some log entries
    // causing some of the requested entries to be unavailable. The log store should
    // return nullptr to indicate such errors.
    ulong end_idx = std::min( cur_nxt_idx,
                              last_log_idx + 1 + ctx_->get_params()->max_append_size_ );

    // NOTE: If this is a retry, probably the follower is down.
    //       Send just one log until it comes back
    //       (i.e., max_append_size_ = 1).
    //       Only when end_idx - start_idx > 1, and 5th try.
    ulong peer_last_sent_idx = p.get_last_sent_idx();
    if ( last_log_idx + 1 == peer_last_sent_idx &&
         last_log_idx + 2 < end_idx ) {
        int32 cur_cnt = p.inc_cnt_not_applied();
        p_db("last sent log (%" PRIu64 ") to peer %d is not applied, cnt %d",
             peer_last_sent_idx, p.get_id(), cur_cnt);
        if (cur_cnt >= 5) {
            ulong prev_end_idx = end_idx;
            end_idx = std::min( cur_nxt_idx, last_log_idx + 1 + 1 );
            p_db("reduce end_idx %" PRIu64 " -> %" PRIu64, prev_end_idx, end_idx);
        }
    } else {
        p.reset_cnt_not_applied();
    }

    ptr<std::vector<ptr<log_entry>>> log_entries;
    if ((last_log_idx + 1) >= cur_nxt_idx) {
        log_entries = ptr<std::vector<ptr<log_entry>>>();
    } else if (entries_valid) {
        log_entries = log_store_->log_entries_ext(last_log_idx + 1, end_idx,
                                                  p.get_next_batch_size_hint_in_bytes());
        if (log_entries == nullptr) {
            p_wn("failed to retrieve log entries: %" PRIu64 " - %" PRIu64,
                 last_log_idx + 1, end_idx);
            entries_valid = false;
        }
    }

    if (!entries_valid) {
        // Required log entries are missing. First, we try to use snapshot to recover.
        // To avoid inconsistency due to smart pointer, should have local varaible
        // to increase its ref count.
        ptr<snapshot> snp_local = get_last_snapshot();

        // Modified by Jung-Sang Ahn (Oct 11 2017):
        // As `reserved_log` has been newly added, need to check snapshot
        // in addition to `starting_idx`.
        if ( snp_local &&
             last_log_idx < starting_idx &&
             last_log_idx < snp_local->get_last_log_idx() ) {
            p_db( "send snapshot peer %d, peer log idx: %" PRIu64
                  ", my starting idx: %" PRIu64 ", "
                  "my log idx: %" PRIu64 ", last_snapshot_log_idx: %" PRIu64,
                  p.get_id(),
                  last_log_idx, starting_idx, cur_nxt_idx,
                  snp_local->get_last_log_idx() );

            bool succeeded_out = false;
            return create_sync_snapshot_req( pp, last_log_idx, term,
                                             commit_idx, succeeded_out );
        }

        // Cannot recover using snapshot. Return here to protect the leader.
        static timer_helper msg_timer(5000000);
        int log_lv = msg_timer.timeout_and_reset() ? L_ERROR : L_TRACE;
        p_lv(log_lv,
             "neither snapshot nor log exists, peer %d, last log %" PRIu64 ", "
             "leader's start log %" PRIu64,
             p.get_id(), last_log_idx, starting_idx);

        // Send out-of-log-range notification to this follower.
        ptr<req_msg> req = cs_new<req_msg>
                           ( term, msg_type::custom_notification_request,
                             id_, p.get_id(), 0, last_log_idx, commit_idx );

        // Out-of-log message.
        ptr<out_of_log_msg> ool_msg = cs_new<out_of_log_msg>();
        ool_msg->start_idx_of_leader_ = starting_idx;

        // Create a notification containing OOL message.
        ptr<custom_notification_msg> custom_noti =
            cs_new<custom_notification_msg>
            ( custom_notification_msg::out_of_log_range_warning );
        custom_noti->ctx_ = ool_msg->serialize();

        // Wrap it using log_entry.
        ptr<log_entry> custom_noti_le =
            cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

        req->log_entries().push_back(custom_noti_le);
        return req;
    }

    ulong last_log_term = term_for_log(last_log_idx);
    ulong adjusted_end_idx = end_idx;
    if (log_entries) adjusted_end_idx = last_log_idx + 1 + log_entries->size();
    if (adjusted_end_idx != end_idx) {
        p_tr("adjusted end_idx due to batch size hint: %" PRIu64 " -> %" PRIu64,
             end_idx, adjusted_end_idx);
    }

    p_db( "append_entries for %d with LastLogIndex=%" PRIu64 ", "
          "LastLogTerm=%" PRIu64 ", EntriesLength=%zu, CommitIndex=%" PRIu64 ", "
          "Term=%" PRIu64 ", peer_last_sent_idx %" PRIu64,
          p.get_id(), last_log_idx, last_log_term,
          ( log_entries ? log_entries->size() : 0 ), commit_idx, term,
          peer_last_sent_idx );
    if (last_log_idx+1 == adjusted_end_idx) {
        p_tr( "EMPTY PAYLOAD" );
    } else if (last_log_idx+1 + 1 == adjusted_end_idx) {
        p_db( "idx: %" PRIu64, last_log_idx+1 );
    } else {
        p_db( "idx range: %" PRIu64 "-%" PRIu64, last_log_idx+1, adjusted_end_idx-1 );
    }

    ptr<req_msg> req
        ( cs_new<req_msg>
          ( term, msg_type::append_entries_request, id_, p.get_id(),
            last_log_term, last_log_idx, commit_idx ) );
    std::vector<ptr<log_entry>>& v = req->log_entries();
    if (log_entries) {
        v.insert(v.end(), log_entries->begin(), log_entries->end());
    }
    p.set_last_sent_idx(last_log_idx + 1);

    return req;
}